

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_phase_callback_registry.cpp
# Opt level: O2

mask_type __thiscall
sc_core::sc_phase_callback_registry::register_callback
          (sc_phase_callback_registry *this,cb_type *cb,mask_type m)

{
  uint uVar1;
  __normal_iterator<sc_core::sc_phase_callback_registry::entry_*,_std::vector<sc_core::sc_phase_callback_registry::entry,_std::allocator<sc_core::sc_phase_callback_registry::entry>_>_>
  _Var2;
  uint uVar3;
  uint uVar4;
  entry new_entry;
  
  _Var2 = std::
          find_if<__gnu_cxx::__normal_iterator<sc_core::sc_phase_callback_registry::entry*,std::vector<sc_core::sc_phase_callback_registry::entry,std::allocator<sc_core::sc_phase_callback_registry::entry>>>,sc_core::(anonymous_namespace)::entry_match>
                    ((this->m_cb_vec).
                     super__Vector_base<sc_core::sc_phase_callback_registry::entry,_std::allocator<sc_core::sc_phase_callback_registry::entry>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     (this->m_cb_vec).
                     super__Vector_base<sc_core::sc_phase_callback_registry::entry,_std::allocator<sc_core::sc_phase_callback_registry::entry>_>
                     ._M_impl.super__Vector_impl_data._M_finish,(entry_match)cb);
  uVar1 = validate_mask(this,cb,m,true);
  if (_Var2._M_current ==
      (this->m_cb_vec).
      super__Vector_base<sc_core::sc_phase_callback_registry::entry,_std::allocator<sc_core::sc_phase_callback_registry::entry>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    if (uVar1 == 0) {
      return 0;
    }
    new_entry.target = cb;
    new_entry.mask = uVar1;
    std::
    vector<sc_core::sc_phase_callback_registry::entry,_std::allocator<sc_core::sc_phase_callback_registry::entry>_>
    ::push_back(&this->m_cb_vec,&new_entry);
    uVar4 = uVar1;
  }
  else {
    uVar3 = (_Var2._M_current)->mask | uVar1;
    uVar4 = ~(_Var2._M_current)->mask & uVar1;
    (_Var2._M_current)->mask = uVar3;
    uVar1 = uVar3;
  }
  if ((uVar4 >> 10 & 1) != 0) {
    new_entry.target = cb;
    std::vector<sc_core::sc_object_*,_std::allocator<sc_core::sc_object_*>_>::push_back
              (&this->m_cb_update_vec,&new_entry.target);
  }
  if ((uVar4 >> 0xb & 1) != 0) {
    new_entry.target = cb;
    std::vector<sc_core::sc_object_*,_std::allocator<sc_core::sc_object_*>_>::push_back
              (&this->m_cb_timestep_vec,&new_entry.target);
  }
  return uVar1;
}

Assistant:

sc_phase_callback_registry::mask_type
sc_phase_callback_registry::register_callback( cb_type& cb, mask_type m )
{
    storage_type::iterator it =
      find_if( m_cb_vec.begin(), m_cb_vec.end(), entry_match(&cb) );

    m = validate_mask(cb, m, /* warn */ true );

    mask_type diff_mask = m;
    mask_type new_mask  = m;

    if( it != m_cb_vec.end() ) // update existing entry
    {
        // update masks
        new_mask   =  (*it).mask | m;
        diff_mask  = ~(*it).mask & m;
        (*it).mask = new_mask;
    }
    else // new entry
    {
        if( !m ) // empty, do nothing
            return SC_UNITIALIZED;

        entry new_entry = { &cb, new_mask };
        m_cb_vec.push_back( new_entry );
    }

    // add to callback shortcut sets
#if 0
    if( diff_mask & SC_END_OF_EVALUATION )
        m_cb_eval_vec.push_back( &cb );
#endif
    if( diff_mask & SC_END_OF_UPDATE )
        m_cb_update_vec.push_back( &cb );
    if( diff_mask & SC_BEFORE_TIMESTEP )
        m_cb_timestep_vec.push_back( &cb );

    return new_mask;
}